

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsolve.c
# Opt level: O2

MATRIX mat_backsubs1(MATRIX A,MATRIX B,MATRIX X,MATRIX P,int xcol)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  
  uVar1 = *(uint *)((long)A + -4);
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  lVar7 = 1;
  for (; lVar2 = lVar7, uVar4 != uVar6; uVar4 = uVar4 + 1) {
    for (; (int)lVar2 < (int)uVar1; lVar2 = lVar2 + 1) {
      *B[(int)*P[lVar2]] = *B[(int)*P[lVar2]] - A[(int)*P[lVar2]][uVar4] * *B[(int)*P[uVar4]];
    }
    lVar7 = lVar7 + 1;
  }
  X[(long)(int)uVar1 + -1][xcol] =
       *B[(int)*P[(long)(int)uVar1 + -1]] / A[(int)*P[(long)(int)uVar1 + -1]][(long)(int)uVar1 + -1]
  ;
  for (uVar3 = uVar1 - 2; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
    uVar6 = (ulong)uVar3;
    iVar5 = (int)*P[uVar6];
    dVar8 = 0.0;
    uVar4 = uVar6;
    while (uVar4 = uVar4 + 1, (int)uVar4 < (int)uVar1) {
      dVar8 = dVar8 + A[iVar5][uVar4] * X[uVar4][xcol];
    }
    X[uVar6][xcol] = (*B[iVar5] - dVar8) / A[iVar5][uVar6];
  }
  return X;
}

Assistant:

MATRIX mat_backsubs1( MATRIX A, MATRIX B, MATRIX X, MATRIX P, int xcol )
{
	int	i, j, k, n;
	double	sum;

	n = MatCol(A);

	for (k=0; k<n; k++)
		{
		for (i=k+1; i<n; i++)
			B[(int)P[i][0]][0] -= A[(int)P[i][0]][k] * B[(int)P[k][0]][0];
		}

	X[n-1][xcol] = B[(int)P[n-1][0]][0] / A[(int)P[n-1][0]][n-1];
	for (k=n-2; k>=0; k--)
		{
		sum = 0.0;
		for (j=k+1; j<n; j++)
			{
			sum += A[(int)P[k][0]][j] * X[j][xcol];
			}
		X[k][xcol] = (B[(int)P[k][0]][0] - sum) / A[(int)P[k][0]][k];
		}

	return (X);
}